

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_EraseIf_Test::TestBody
          (ParallelFlatHashSet_EraseIf_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  iterator *piVar3;
  iterator *value;
  iterator *value_00;
  EmbeddedSet *set;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> *key;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  *prVar4;
  slot_type sVar5;
  char *pcVar6;
  iterator iVar7;
  initializer_list<phmap::priv::(anonymous_namespace)::Entry> iVar8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_4;
  Set m;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> in_stack_fffffffffffffc28;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> kVar9;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> kVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined1 local_3b8 [8];
  anon_union_8_1_a8a14541_for_iterator_1 aStack_3b0;
  ctrl_t *local_3a8;
  anon_union_8_1_a8a14541_for_iterator_1 local_3a0;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_380;
  undefined8 local_378;
  undefined8 local_368;
  internal local_350 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  string local_340;
  key_arg<phmap::priv::(anonymous_namespace)::Entry> local_320;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  local_318;
  
  piVar3 = (iterator *)&stack0xfffffffffffffc28;
  local_3b8._0_4_ = 1;
  local_3b8._4_4_ = 7;
  aStack_3b0.slot_ = (slot_type *)0x900000002;
  local_3a8 = (ctrl_t *)0x600000005;
  iVar8._M_len = 3;
  iVar8._M_array = (iterator)local_3b8;
  parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::(anonymous_namespace)::Entry,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>,_4UL,_phmap::NullMutex>
                       *)&local_318,iVar8,(size_t)&local_388,(hasher *)&stack0xfffffffffffffc28,
                      (key_equal *)&local_340,(allocator_type *)in_stack_fffffffffffffc28);
  local_388.key = 9;
  local_388.value = 0;
  prVar4 = &local_318.sets_._M_elems[0xd].set_;
  key = &local_388;
  iVar7 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find<phmap::priv::(anonymous_namespace)::Entry>(prVar4,key,0x9302dea42e0e2d9e);
  if (iVar7.ctrl_ !=
      local_318.sets_._M_elems[0xd].set_.ctrl_ + local_318.sets_._M_elems[0xd].set_.capacity_) {
    bVar2 = TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)prVar4,key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
    if ((Entry)local_3b8 != (Entry)0x0) {
      (**(code **)(*(long *)local_3b8 + 8))();
    }
    local_3b8._0_4_ = 0;
    local_3b8._4_4_ = 0;
    if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_348,local_348);
    }
    local_348 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::~parallel_hash_set(&local_318);
    _Unwind_Resume(bVar2);
  }
  local_340._M_dataplus._M_p._0_4_ = (uint)local_340._M_dataplus._M_p & 0xffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_3b8,
             "m.erase_if(Entry{9}, [](Set::value_type& v) { (static_cast <bool> (0) ? void (0) : __assert_fail (\"0\", \"/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc\", 95, __extension__ __PRETTY_FUNCTION__)); return v.value == 12; })"
             ,"false",(bool *)&stack0xfffffffffffffc28,(bool *)&local_340);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5 = (slot_type)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      sVar5 = *aStack_3b0.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x5f,(char *)sVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc28,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
    if (local_388 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_388 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_3b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0.slot_);
  }
  local_388.key = 5;
  local_388.value = 0;
  prVar4 = &local_318.sets_._M_elems[5].set_;
  iVar7 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find<phmap::priv::(anonymous_namespace)::Entry>(prVar4,&local_388,0xf4e2d492cc048d2f);
  if ((iVar7.ctrl_ !=
       local_318.sets_._M_elems[5].set_.ctrl_ + local_318.sets_._M_elems[5].set_.capacity_) &&
     ((iVar7.field_1.slot_)->value == 0xc)) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::_erase(prVar4,iVar7);
  }
  local_340._M_dataplus._M_p._0_4_ = (uint)local_340._M_dataplus._M_p & 0xffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_3b8,
             "m.erase_if(Entry{5}, [](Set::value_type& v) { return v.value == 12; })","false",
             (bool *)&stack0xfffffffffffffc28,(bool *)&local_340);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5 = (slot_type)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      sVar5 = *aStack_3b0.slot_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x60,(char *)sVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc28,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
    if (local_388 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_388 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_3b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0.slot_);
  }
  kVar9.key = 0;
  kVar9.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>
            ((iterator *)local_3b8,&local_318,
             (key_arg<phmap::priv::(anonymous_namespace)::Entry> *)&stack0xfffffffffffffc28);
  local_340._M_dataplus._M_p._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_388,"m.find(Entry{5})->value","6",&(local_3a0.slot_)->value,
             (int *)&local_340);
  if ((char)local_388.key == '\0') {
    testing::Message::Message((Message *)local_3b8);
    if (pbStack_380 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_380->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x61,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc28,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
    if ((Entry)local_3b8 != (Entry)0x0) {
      (**(code **)(*(long *)local_3b8 + 8))();
    }
  }
  if (pbStack_380 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_380,pbStack_380);
  }
  local_388.key = 5;
  local_388.value = 0;
  iVar7 = raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
          ::find<phmap::priv::(anonymous_namespace)::Entry>(prVar4,&local_388,0xf4e2d492cc048d2f);
  if ((iVar7.ctrl_ ==
       local_318.sets_._M_elems[5].set_.ctrl_ + local_318.sets_._M_elems[5].set_.capacity_) ||
     ((iVar7.field_1.slot_)->value != 6)) {
    uVar1 = 0;
  }
  else {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::_erase(prVar4,iVar7);
    uVar1 = 1;
  }
  kVar10._1_7_ = kVar9._1_7_;
  kVar10.key._0_1_ = uVar1;
  local_340._M_dataplus._M_p._0_4_ = CONCAT31(local_340._M_dataplus._M_p._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_3b8,
             "m.erase_if(Entry{5}, [](Set::value_type& v) { return v.value == 6; })","true",
             (bool *)&stack0xfffffffffffffc28,(bool *)&local_340);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5 = (slot_type)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      sVar5 = *aStack_3b0.slot_;
    }
    piVar3 = (iterator *)0x62;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x62,(char *)sVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc28,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
    if (local_388 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)0x0) {
      (**(code **)(*(long *)local_388 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_3b0.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_3b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0.slot_);
  }
  local_320.key = 5;
  local_320.value = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::find<phmap::priv::(anonymous_namespace)::Entry>((iterator *)local_3b8,&local_318,&local_320);
  local_368 = 0;
  local_388.key = 0;
  local_388.value = 0;
  pbStack_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_378 = 0;
  if ((Entry)local_3b8 == (Entry)0x0) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>::iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>::iterator>
              ((string *)&stack0xfffffffffffffc28,(internal *)local_3b8,value,piVar3);
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>::iterator,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>::iterator>
              (&local_340,(internal *)&local_388,value_00,piVar3);
    testing::internal::EqFailure
              (local_350,"m.find(Entry{5})","m.end()",(string *)&stack0xfffffffffffffc28,&local_340,
               false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_340._M_dataplus._M_p._4_4_,(uint)local_340._M_dataplus._M_p) !=
        &local_340.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_340._M_dataplus._M_p._4_4_,(uint)local_340._M_dataplus._M_p),
                      local_340.field_2._M_allocated_capacity + 1);
    }
    if (kVar10 != (key_arg<phmap::priv::(anonymous_namespace)::Entry>)&local_3c8) {
      operator_delete((void *)kVar10,(ulong)(local_3c8._M_allocated_capacity + 1));
    }
  }
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,99,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_388,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
    if ((Entry)local_3b8 != (Entry)0x0) {
      (**(code **)(*(long *)local_3b8 + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  ::~parallel_hash_set(&local_318);
  return;
}

Assistant:

Entry(int k, int v=0) : key(k), value(v) {}